

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O0

void __thiscall
trompeloeil::call_matcher<void_(),_std::tuple<>_>::call_matcher<>
          (call_matcher<void_(),_std::tuple<>_> *this,char *file,unsigned_long line,
          char *call_string)

{
  unique_ptr<trompeloeil::sequence_handler<0UL>,_std::default_delete<trompeloeil::sequence_handler<0UL>_>_>
  local_40;
  location local_38;
  char *local_28;
  char *call_string_local;
  unsigned_long line_local;
  char *file_local;
  call_matcher<void_(),_std::tuple<>_> *this_local;
  
  local_28 = call_string;
  call_string_local = (char *)line;
  line_local = (unsigned_long)file;
  file_local = (char *)this;
  location::location(&local_38,file,line);
  call_matcher_base<void_()>::call_matcher_base
            (&this->super_call_matcher_base<void_()>,local_38,local_28);
  expectation::expectation(&this->super_expectation);
  (this->super_call_matcher_base<void_()>).super_list_elem<trompeloeil::call_matcher_base<void_()>_>
  ._vptr_list_elem = (_func_int **)&PTR__call_matcher_0024cd88;
  (this->super_expectation)._vptr_expectation = (_func_int **)&DAT_0024cdf0;
  list<trompeloeil::condition_base<void_()>,_trompeloeil::delete_disposer>::list(&this->conditions);
  list<trompeloeil::side_effect_base<void_()>,_trompeloeil::delete_disposer>::list(&this->actions);
  std::
  unique_ptr<trompeloeil::return_handler<void()>,std::default_delete<trompeloeil::return_handler<void()>>>
  ::unique_ptr<std::default_delete<trompeloeil::return_handler<void()>>,void>
            ((unique_ptr<trompeloeil::return_handler<void()>,std::default_delete<trompeloeil::return_handler<void()>>>
              *)&this->return_handler_obj);
  detail::make_unique<trompeloeil::sequence_handler<0ul>>();
  std::
  unique_ptr<trompeloeil::sequence_handler_base,std::default_delete<trompeloeil::sequence_handler_base>>
  ::
  unique_ptr<trompeloeil::sequence_handler<0ul>,std::default_delete<trompeloeil::sequence_handler<0ul>>,void>
            ((unique_ptr<trompeloeil::sequence_handler_base,std::default_delete<trompeloeil::sequence_handler_base>>
              *)&this->sequences,&local_40);
  Catch::clara::std::
  unique_ptr<trompeloeil::sequence_handler<0UL>,_std::default_delete<trompeloeil::sequence_handler<0UL>_>_>
  ::~unique_ptr(&local_40);
  this->reported = false;
  return;
}

Assistant:

call_matcher(
      char const *file,
      unsigned long line,
      char const *call_string,
      U &&... u)
    : call_matcher_base<Sig>(location{file, line}, call_string)
    , val(std::forward<U>(u)...)
    {}